

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O0

void __thiscall QListView::mouseReleaseEvent(QListView *this,QMouseEvent *e)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  QListViewPrivate *pQVar4;
  QStyle *pQVar5;
  undefined8 in_RSI;
  QRect *in_RDI;
  long in_FS_OFFSET;
  QMouseEvent *unaff_retaddr;
  QAbstractItemView *in_stack_00000008;
  int margin;
  QListViewPrivate *d;
  QRect viewPortRect;
  QWidget *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa8;
  undefined1 extend;
  QRect *rect;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  int in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  QRect *in_stack_ffffffffffffffd8;
  
  extend = (undefined1)((ulong)in_RSI >> 0x38);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  rect = in_RDI;
  pQVar4 = d_func((QListView *)0x87896f);
  QAbstractItemView::mouseReleaseEvent(in_stack_00000008,unaff_retaddr);
  if (((pQVar4->showElasticBand & 1U) != 0) && (bVar2 = QRect::isValid(in_RDI), bVar2)) {
    pQVar5 = QWidget::style(in_stack_ffffffffffffff98);
    iVar3 = (**(code **)(*(long *)pQVar5 + 0xe0))(pQVar5,5,0);
    iVar3 = iVar3 << 1;
    QRect::adjusted(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0,
                    in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
    QListViewPrivate::mapToViewport
              ((QListViewPrivate *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
               rect,(bool)extend);
    QWidget::update((QWidget *)CONCAT44(iVar3,in_stack_ffffffffffffffa8),in_RDI);
    QRect::QRect(in_RDI);
    (pQVar4->elasticBand).x1 = (Representation)in_stack_ffffffffffffffc8;
    (pQVar4->elasticBand).y1 = (Representation)in_stack_ffffffffffffffcc;
    (pQVar4->elasticBand).x2 = (Representation)in_stack_ffffffffffffffd0;
    (pQVar4->elasticBand).y2 = (Representation)in_stack_ffffffffffffffd4;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QListView::mouseReleaseEvent(QMouseEvent *e)
{
    Q_D(QListView);
    QAbstractItemView::mouseReleaseEvent(e);
    // #### move this implementation into a dynamic class
    if (d->showElasticBand && d->elasticBand.isValid()) {
        const int margin = 2 * style()->pixelMetric(QStyle::PM_DefaultFrameWidth);
        const QRect viewPortRect = d->elasticBand.adjusted(-margin, -margin, margin, margin);
        d->viewport->update(d->mapToViewport(viewPortRect));
        d->elasticBand = QRect();
    }
}